

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::SamplerLODCase::test
          (SamplerLODCase *this,CallLogWrapper *gl,ResultCollector *result)

{
  bool bVar1;
  deBool dVar2;
  TestLog *pTVar3;
  Enum<int,_2UL> EVar4;
  int local_46c;
  bool local_459;
  GetNameFunc local_448;
  int local_440;
  string local_438;
  allocator<char> local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  GLenum local_38c;
  int local_388;
  deUint32 err_3;
  GLint ref_3;
  int ndx_3;
  int local_378;
  GetNameFunc local_370;
  int local_368;
  string local_360;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  GLenum local_2b8;
  float local_2b4;
  deUint32 err_2;
  GLfloat ref_2;
  int ndx_2;
  int minLimit;
  int local_2a0;
  GetNameFunc local_298;
  int local_290;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  GLenum local_1dc;
  uint local_1d8;
  deUint32 err_1;
  GLuint ref_1;
  int ndx_1;
  int local_1c8;
  GetNameFunc local_1c0;
  int local_1b8;
  string local_1b0;
  allocator<char> local_189;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  GLenum local_104;
  int local_100;
  deUint32 err;
  GLint ref;
  int ndx;
  Random rnd;
  int numIterations;
  allocator<char> local_b9;
  string local_b8;
  ScopedLogSection local_98;
  ScopedLogSection section_1;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  int initialValue;
  bool isPureCase;
  ResultCollector *result_local;
  CallLogWrapper *gl_local;
  SamplerLODCase *this_local;
  
  bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
  local_459 = true;
  if (!bVar1) {
    local_459 = isPureUintTester((this->super_SamplerTest).m_tester);
  }
  section.m_log._7_1_ = local_459;
  if ((this->super_SamplerTest).m_pname == 0x813a) {
    local_46c = -1000;
  }
  else {
    local_46c = -1;
    if ((this->super_SamplerTest).m_pname == 0x813b) {
      local_46c = 1000;
    }
  }
  section.m_log._0_4_ = local_46c;
  bVar1 = querySupportsSigned((this->super_SamplerTest).m_type);
  if (((bVar1) || (-1 < (int)section.m_log)) && ((section.m_log._7_1_ & 1) == 0)) {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Initial",&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Initial",(allocator<char> *)((long)&section_1.m_log + 7));
    tcu::ScopedLogSection::ScopedLogSection(&local_30,pTVar3,&local_50,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    StateQueryUtil::verifyStateSamplerParamInteger
              (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
               (int)section.m_log,(this->super_SamplerTest).m_type);
    tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  }
  pTVar3 = tcu::TestContext::getLog
                     ((this->super_SamplerTest).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"Set",&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&numIterations,"Set",(allocator<char> *)((long)&rnd.m_rnd.w + 3));
  tcu::ScopedLogSection::ScopedLogSection(&local_98,pTVar3,&local_b8,(string *)&numIterations);
  std::__cxx11::string::~string((string *)&numIterations);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rnd.m_rnd.w + 3));
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  rnd.m_rnd.z = 0x14;
  de::Random::Random((Random *)&ref,0xabcdef);
  if ((section.m_log._7_1_ & 1) == 0) {
    bVar1 = querySupportsSigned((this->super_SamplerTest).m_type);
    ref_2 = 0.0;
    if (bVar1) {
      ref_2 = -NAN;
    }
    for (err_2 = 0; (int)err_2 < 0x14; err_2 = err_2 + 1) {
      local_2b4 = de::Random::getFloat((Random *)&ref,(float)(int)ref_2,1000.0);
      glu::CallLogWrapper::glSamplerParameterf
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,local_2b4);
      do {
        local_2b8 = glu::CallLogWrapper::glGetError(gl);
        if (local_2b8 != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_338,"Got Error ",&local_339);
          EVar4 = glu::getErrorStr(local_2b8);
          _ref_3 = EVar4.m_getName;
          local_378 = EVar4.m_value;
          local_370 = _ref_3;
          local_368 = local_378;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_360,&local_370);
          std::operator+(&local_318,&local_338,&local_360);
          std::operator+(&local_2f8,&local_318,": ");
          std::operator+(&local_2d8,&local_2f8,"glSamplerParameterf");
          tcu::ResultCollector::fail(result,&local_2d8);
          std::__cxx11::string::~string((string *)&local_2d8);
          std::__cxx11::string::~string((string *)&local_2f8);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_360);
          std::__cxx11::string::~string((string *)&local_338);
          std::allocator<char>::~allocator(&local_339);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamFloat
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 local_2b4,(this->super_SamplerTest).m_type);
    }
    for (err_3 = 0; (int)err_3 < 0x14; err_3 = err_3 + 1) {
      local_388 = de::Random::getInt((Random *)&ref,(int)ref_2,1000);
      glu::CallLogWrapper::glSamplerParameteri
                (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,local_388);
      do {
        local_38c = glu::CallLogWrapper::glGetError(gl);
        if (local_38c != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_410,"Got Error ",&local_411);
          EVar4 = glu::getErrorStr(local_38c);
          local_448 = EVar4.m_getName;
          local_440 = EVar4.m_value;
          tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_438,&local_448);
          std::operator+(&local_3f0,&local_410,&local_438);
          std::operator+(&local_3d0,&local_3f0,": ");
          std::operator+(&local_3b0,&local_3d0,"glSamplerParameteri");
          tcu::ResultCollector::fail(result,&local_3b0);
          std::__cxx11::string::~string((string *)&local_3b0);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::__cxx11::string::~string((string *)&local_3f0);
          std::__cxx11::string::~string((string *)&local_438);
          std::__cxx11::string::~string((string *)&local_410);
          std::allocator<char>::~allocator(&local_411);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
      StateQueryUtil::verifyStateSamplerParamFloat
                (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                 (float)local_388,(this->super_SamplerTest).m_type);
    }
  }
  else {
    bVar1 = isPureIntTester((this->super_SamplerTest).m_tester);
    if (bVar1) {
      for (err = 0; (int)err < 0x14; err = err + 1) {
        local_100 = de::Random::getInt((Random *)&ref,-1000,1000);
        glu::CallLogWrapper::glSamplerParameterIiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   &local_100);
        do {
          local_104 = glu::CallLogWrapper::glGetError(gl);
          if (local_104 != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,"Got Error ",&local_189);
            EVar4 = glu::getErrorStr(local_104);
            _ref_1 = EVar4.m_getName;
            local_1c8 = EVar4.m_value;
            local_1c0 = _ref_1;
            local_1b8 = local_1c8;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_1b0,&local_1c0);
            std::operator+(&local_168,&local_188,&local_1b0);
            std::operator+(&local_148,&local_168,": ");
            std::operator+(&local_128,&local_148,"glSamplerParameterIiv");
            tcu::ResultCollector::fail(result,&local_128);
            std::__cxx11::string::~string((string *)&local_128);
            std::__cxx11::string::~string((string *)&local_148);
            std::__cxx11::string::~string((string *)&local_168);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator(&local_189);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        StateQueryUtil::verifyStateSamplerParamFloat
                  (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   (float)local_100,(this->super_SamplerTest).m_type);
      }
    }
    else {
      for (err_1 = 0; (int)err_1 < 0x14; err_1 = err_1 + 1) {
        local_1d8 = de::Random::getInt((Random *)&ref,0,1000);
        glu::CallLogWrapper::glSamplerParameterIuiv
                  (gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   &local_1d8);
        do {
          local_1dc = glu::CallLogWrapper::glGetError(gl);
          if (local_1dc != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_260,"Got Error ",&local_261);
            EVar4 = glu::getErrorStr(local_1dc);
            _ndx_2 = EVar4.m_getName;
            local_2a0 = EVar4.m_value;
            local_298 = _ndx_2;
            local_290 = local_2a0;
            tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_298);
            std::operator+(&local_240,&local_260,&local_288);
            std::operator+(&local_220,&local_240,": ");
            std::operator+(&local_200,&local_220,"glSamplerParameterIuiv");
            tcu::ResultCollector::fail(result,&local_200);
            std::__cxx11::string::~string((string *)&local_200);
            std::__cxx11::string::~string((string *)&local_220);
            std::__cxx11::string::~string((string *)&local_240);
            std::__cxx11::string::~string((string *)&local_288);
            std::__cxx11::string::~string((string *)&local_260);
            std::allocator<char>::~allocator(&local_261);
          }
          dVar2 = ::deGetFalse();
        } while (dVar2 != 0);
        StateQueryUtil::verifyStateSamplerParamFloat
                  (result,gl,(this->super_SamplerTest).m_target,(this->super_SamplerTest).m_pname,
                   (float)local_1d8,(this->super_SamplerTest).m_type);
      }
    }
  }
  de::Random::~Random((Random *)&ref);
  tcu::ScopedLogSection::~ScopedLogSection(&local_98);
  return;
}

Assistant:

void SamplerLODCase::test (glu::CallLogWrapper& gl, tcu::ResultCollector& result) const
{
	const bool	isPureCase		= isPureIntTester(m_tester) || isPureUintTester(m_tester);
	const int	initialValue	= (m_pname == GL_TEXTURE_MIN_LOD) ? (-1000)
								: (m_pname == GL_TEXTURE_MAX_LOD) ? (1000)
								: (-1);

	if ((querySupportsSigned(m_type) || initialValue >= 0) && !isPureCase)
	{
		const tcu::ScopedLogSection section(m_testCtx.getLog(), "Initial", "Initial");
		verifyStateSamplerParamInteger(result, gl, m_target, m_pname, initialValue, m_type);
	}

	{
		const tcu::ScopedLogSection	section			(m_testCtx.getLog(), "Set", "Set");
		const int					numIterations	= 20;
		de::Random					rnd				(0xabcdef);

		if (isPureCase)
		{
			if (isPureIntTester(m_tester))
			{
				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLint ref = rnd.getInt(-1000, 1000);

					gl.glSamplerParameterIiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIiv");

					verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
			else
			{
				DE_ASSERT(isPureUintTester(m_tester));

				for (int ndx = 0; ndx < numIterations; ++ndx)
				{
					const GLuint ref = (glw::GLuint)rnd.getInt(0, 1000);

					gl.glSamplerParameterIuiv(m_target, m_pname, &ref);
					GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterIuiv");

					verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
				}
			}
		}
		else
		{
			const int minLimit = (querySupportsSigned(m_type)) ? (-1000) : (0);

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLfloat ref = rnd.getFloat((float)minLimit, 1000.f);

				gl.glSamplerParameterf(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameterf");

				verifyStateSamplerParamFloat(result, gl, m_target, m_pname, ref, m_type);
			}

			// check unit conversions with int

			for (int ndx = 0; ndx < numIterations; ++ndx)
			{
				const GLint ref = rnd.getInt(minLimit, 1000);

				gl.glSamplerParameteri(m_target, m_pname, ref);
				GLS_COLLECT_GL_ERROR(result, gl.glGetError(), "glSamplerParameteri");

				verifyStateSamplerParamFloat(result, gl, m_target, m_pname, (float)ref, m_type);
			}
		}
	}
}